

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeView::selectAll(QTreeView *this)

{
  SelectionMode SVar1;
  bool bVar2;
  int iVar3;
  QFlags<QItemSelectionModel::SelectionFlag> QVar4;
  QTreeViewPrivate *this_00;
  QItemSelectionModel *pQVar5;
  QTreeViewItem *pQVar6;
  fd_set *in_R8;
  timeval *in_R9;
  long in_FS_OFFSET;
  QModelIndex *idx;
  SelectionMode mode;
  QTreeViewPrivate *d;
  QModelIndex lastItemIndex;
  QList<QTreeViewItem> *in_stack_ffffffffffffff68;
  QAbstractItemViewPrivate *in_stack_ffffffffffffff70;
  QAbstractItemModel *this_01;
  undefined4 in_stack_ffffffffffffff80;
  undefined1 local_38 [24];
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QTreeView *)0x8fe470);
  pQVar5 = QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_ffffffffffffff70);
  if (pQVar5 != (QItemSelectionModel *)0x0) {
    SVar1 = (this_00->super_QAbstractItemViewPrivate).selectionMode;
    QAbstractItemViewPrivate::executePostedLayout(in_stack_ffffffffffffff70);
    if (((SVar1 != SingleSelection) && (SVar1 != NoSelection)) &&
       (bVar2 = QList<QTreeViewItem>::isEmpty((QList<QTreeViewItem> *)0x8fe4ca), !bVar2)) {
      pQVar6 = QList<QTreeViewItem>::constLast(in_stack_ffffffffffffff68);
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      iVar3 = QModelIndex::row(&pQVar6->index);
      this_01 = (this_00->super_QAbstractItemViewPrivate).model;
      QModelIndex::parent((QModelIndex *)CONCAT44(iVar3,in_stack_ffffffffffffff80));
      (**(code **)(*(long *)this_01 + 0x80))(this_01,local_38);
      QModelIndex::sibling
                ((QModelIndex *)CONCAT44(iVar3,in_stack_ffffffffffffff80),
                 (int)((ulong)pQVar6 >> 0x20),(int)pQVar6);
      pQVar6 = QList<QTreeViewItem>::constFirst((QList<QTreeViewItem> *)this_01);
      QVar4 = ::operator|((enum_type)((ulong)this_01 >> 0x20),(enum_type)this_01);
      QTreeViewPrivate::select
                (this_00,(int)pQVar6,(fd_set *)&stack0xffffffffffffffe0,
                 (fd_set *)
                 (ulong)(uint)QVar4.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>
                              .super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i,in_R8,in_R9
                );
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::selectAll()
{
    Q_D(QTreeView);
    if (!selectionModel())
        return;
    SelectionMode mode = d->selectionMode;
    d->executePostedLayout(); //make sure we lay out the items
    if (mode != SingleSelection && mode != NoSelection && !d->viewItems.isEmpty()) {
        const QModelIndex &idx = d->viewItems.constLast().index;
        QModelIndex lastItemIndex = idx.sibling(idx.row(), d->model->columnCount(idx.parent()) - 1);
        d->select(d->viewItems.constFirst().index, lastItemIndex,
                  QItemSelectionModel::ClearAndSelect
                  |QItemSelectionModel::Rows);
    }
}